

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O1

bool JSON::ExtractString(wchar_t **data,wstring *str)

{
  wchar_t wVar1;
  byte bVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  byte unaff_BPL;
  uint uVar5;
  long lVar6;
  bool bVar7;
  
  std::__cxx11::wstring::_M_replace((ulong)str,0,(wchar_t *)str->_M_string_length,0x17f930);
LAB_001722b6:
  pwVar4 = *data;
  wVar1 = *pwVar4;
  if (wVar1 == L'\"') {
    *data = pwVar4 + 1;
    std::__cxx11::wstring::reserve();
    unaff_BPL = 1;
    goto LAB_0017232c;
  }
  if (wVar1 == L'\\') {
    *data = pwVar4 + 1;
    wVar1 = pwVar4[1];
    bVar2 = 0;
    if (wVar1 < L'b') {
      if (((wVar1 == L'\"') || (wVar1 == L'/')) || (bVar7 = false, wVar1 == L'\\'))
      goto LAB_00172427;
      goto switchD_00172344_caseD_6f;
    }
    bVar7 = false;
    switch(wVar1) {
    case L'n':
      goto LAB_00172427;
    case L'o':
    case L'p':
    case L'q':
    case L's':
      break;
    case L'r':
      goto LAB_00172427;
    case L't':
      goto LAB_00172427;
    case L'u':
      lVar6 = 1;
      do {
        if (lVar6 == 6) {
          pwVar3 = *data;
          pwVar4 = pwVar3 + 4;
          bVar7 = false;
          uVar5 = 0;
          goto LAB_001723bb;
        }
        bVar2 = 0;
        pwVar3 = pwVar4 + lVar6;
        lVar6 = lVar6 + 1;
        bVar7 = false;
      } while (*pwVar3 != L'\0');
      break;
    default:
      if ((wVar1 == L'b') || (bVar7 = false, bVar2 = 0, wVar1 == L'f')) goto LAB_00172427;
    }
    goto switchD_00172344_caseD_6f;
  }
  if (wVar1 != L'\0') {
    if (L'\x1f' < wVar1 || wVar1 == L'\t') goto LAB_00172427;
    unaff_BPL = 0;
    goto LAB_0017232c;
  }
  bVar2 = 0;
  goto LAB_00172445;
  while( true ) {
    bVar7 = 2 < uVar5;
    uVar5 = uVar5 + 1;
    if (uVar5 == 4) break;
LAB_001723bb:
    pwVar3 = pwVar3 + 1;
    wVar1 = *pwVar3;
    if (((9 < (uint)(wVar1 + L'\xffffffd0')) && (5 < (uint)(wVar1 + L'\xffffffbf'))) &&
       (5 < (uint)(wVar1 + L'\xffffff9f'))) {
      unaff_BPL = 0;
      pwVar4 = pwVar3;
      break;
    }
  }
  *data = pwVar4;
  if (bVar7) {
LAB_00172427:
    std::__cxx11::wstring::push_back((wchar_t)str);
    *data = *data + 1;
    bVar7 = true;
    bVar2 = unaff_BPL;
  }
  else {
LAB_0017232c:
    bVar7 = false;
    bVar2 = unaff_BPL;
  }
switchD_00172344_caseD_6f:
  unaff_BPL = bVar2;
  if (!bVar7) {
LAB_00172445:
    return (bool)(bVar2 & 1);
  }
  goto LAB_001722b6;
}

Assistant:

bool JSON::ExtractString(const wchar_t **data, std::wstring &str)
{
	str = L"";
	
	while (**data != 0)
	{
		// Save the char so we can change it if need be
		wchar_t next_char = **data;
		
		// Escaping something?
		if (next_char == L'\\')
		{
			// Move over the escape char
			(*data)++;
			
			// Deal with the escaped char
			switch (**data)
			{
				case L'"': next_char = L'"'; break;
				case L'\\': next_char = L'\\'; break;
				case L'/': next_char = L'/'; break;
				case L'b': next_char = L'\b'; break;
				case L'f': next_char = L'\f'; break;
				case L'n': next_char = L'\n'; break;
				case L'r': next_char = L'\r'; break;
				case L't': next_char = L'\t'; break;
				case L'u':
				{
					// We need 5 chars (4 hex + the 'u') or its not valid
					if (!simplejson_wcsnlen(*data, 5))
						return false;
					
					// Deal with the chars
					next_char = 0;
					for (int i = 0; i < 4; i++)
					{
						// Do it first to move off the 'u' and leave us on the
						// final hex digit as we move on by one later on
						(*data)++;
						
						next_char <<= 4;
						
						// Parse the hex digit
						if (**data >= '0' && **data <= '9')
							next_char |= (**data - '0');
						else if (**data >= 'A' && **data <= 'F')
							next_char |= (10 + (**data - 'A'));
						else if (**data >= 'a' && **data <= 'f')
							next_char |= (10 + (**data - 'a'));
						else
						{
							// Invalid hex digit = invalid JSON
							return false;
						}
					}
					break;
				}
				
				// By the spec, only the above cases are allowed
				default:
					return false;
			}
		}
		
		// End of the string?
		else if (next_char == L'"')
		{
			(*data)++;
			str.reserve(); // Remove unused capacity
			return true;
		}
		
		// Disallowed char?
		else if (next_char < L' ' && next_char != L'\t')
		{
			// SPEC Violation: Allow tabs due to real world cases
			return false;
		}
		
		// Add the next char
		str += next_char;
		
		// Move on
		(*data)++;
	}
	
	// If we're here, the string ended incorrectly
	return false;
}